

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::ClassNameWorker_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,Descriptor *descriptor)

{
  Descriptor *pDVar1;
  string *__rhs;
  Descriptor *descriptor_00;
  string local_68;
  undefined1 local_38 [8];
  string name;
  Descriptor *descriptor_local;
  
  name.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  pDVar1 = Descriptor::containing_type((Descriptor *)name.field_2._8_8_);
  if (pDVar1 != (Descriptor *)0x0) {
    pDVar1 = Descriptor::containing_type((Descriptor *)name.field_2._8_8_);
    ClassNameWorker_abi_cxx11_(&local_68,(objectivec *)pDVar1,descriptor_00);
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::operator+=((string *)local_38,"_");
  }
  __rhs = Descriptor::name_abi_cxx11_((Descriptor *)name.field_2._8_8_);
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__rhs
                );
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameWorker(const Descriptor* descriptor) {
  string name;
  if (descriptor->containing_type() != NULL) {
    name = ClassNameWorker(descriptor->containing_type());
    name += "_";
  }
  return name + descriptor->name();
}